

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O0

void __thiscall scApp::commandOptions::astcOptions::astcOptions(astcOptions *this)

{
  int iVar1;
  undefined4 *in_RDI;
  int i;
  uint32_t tc;
  uint v;
  undefined4 in_stack_fffffffffffffff0;
  
  clampedOption<unsigned_int>::clampedOption
            ((clampedOption<unsigned_int> *)(in_RDI + 8),in_RDI + 2,1,10000);
  clampedOption<unsigned_int>::clampedOption
            ((clampedOption<unsigned_int> *)(in_RDI + 0xc),in_RDI + 3,0,0x17);
  clampedOption<unsigned_int>::clampedOption
            ((clampedOption<unsigned_int> *)(in_RDI + 0x10),in_RDI + 4,0,2);
  clampedOption<unsigned_int>::clampedOption
            ((clampedOption<unsigned_int> *)(in_RDI + 0x14),in_RDI + 5,0,100);
  iVar1 = std::thread::hardware_concurrency();
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  in_RDI[0xb] = iVar1;
  v = (uint)((ulong)in_RDI >> 0x20);
  clampedOption<unsigned_int>::operator=
            ((clampedOption<unsigned_int> *)CONCAT44(iVar1,in_stack_fffffffffffffff0),v);
  *in_RDI = 0x20;
  clampedOption<unsigned_int>::clear((clampedOption<unsigned_int> *)(in_RDI + 0xc));
  clampedOption<unsigned_int>::operator=
            ((clampedOption<unsigned_int> *)CONCAT44(iVar1,in_stack_fffffffffffffff0),v);
  clampedOption<unsigned_int>::clear((clampedOption<unsigned_int> *)(in_RDI + 0x10));
  clampedOption<unsigned_int>::clear((clampedOption<unsigned_int> *)(in_RDI + 0x14));
  *(undefined1 *)(in_RDI + 6) = 0;
  for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
    *(undefined1 *)((long)in_RDI + (long)iVar1 + 0x1a) = 0;
  }
  return;
}

Assistant:

astcOptions() :
                threadCount(ktxAstcParams::threadCount, 1, 10000),
                blockDimension(ktxAstcParams::blockDimension, 0, KTX_PACK_ASTC_BLOCK_DIMENSION_MAX),
                mode(ktxAstcParams::mode, 0, KTX_PACK_ASTC_ENCODER_MODE_MAX),
                qualityLevel(ktxAstcParams::qualityLevel, 0, KTX_PACK_ASTC_QUALITY_LEVEL_MAX)
            {
                uint32_t tc = thread::hardware_concurrency();
                if (tc == 0) tc = 1;
                threadCount.max = tc;
                threadCount = tc;

                structSize = sizeof(ktxAstcParams);
                blockDimension.clear();
                blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_6x6;
                mode.clear();
                qualityLevel.clear();
                normalMap = false;
                for (int i = 0; i < 4; i++) inputSwizzle[i] = 0;
            }